

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int parse_schema_json_predicate
              (char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,char **value,
              int *val_len,int *has_predicate)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x3f8,
                  "int parse_schema_json_predicate(const char *, const char **, int *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (mod_name != (char **)0x0) {
    *mod_name = (char *)0x0;
  }
  if (mod_name_len != (int *)0x0) {
    *mod_name_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  if (value != (char **)0x0) {
    *value = (char *)0x0;
  }
  if (val_len != (int *)0x0) {
    *val_len = 0;
  }
  if (has_predicate != (int *)0x0) {
    *has_predicate = 0;
  }
  if (*id != '[') {
    return 0;
  }
  ppuVar6 = __ctype_b_loc();
  uVar11 = 0;
  do {
    uVar14 = uVar11;
    cVar10 = id[uVar14 + 1];
    uVar1 = (*ppuVar6)[cVar10];
    uVar11 = uVar14 + 1;
  } while ((uVar1 >> 0xd & 1) != 0);
  pcVar7 = id + uVar11;
  if (cVar10 == '.') {
    if (name != (char **)0x0) {
      *name = pcVar7;
    }
    lVar8 = 1;
LAB_001111b8:
    uVar5 = (uint)lVar8;
    if (nam_len != (int *)0x0) {
      *nam_len = uVar5;
    }
  }
  else {
    if ((uVar1 >> 0xb & 1) != 0) {
      if (cVar10 == '0') goto LAB_00111351;
      lVar8 = 0;
      do {
        lVar4 = uVar14 + 2 + lVar8;
        lVar8 = lVar8 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)id[lVar4] * 2 + 1) & 8) != 0);
      if (name != (char **)0x0) {
        *name = pcVar7;
      }
      goto LAB_001111b8;
    }
    uVar5 = parse_node_identifier(pcVar7,mod_name,mod_name_len,name,nam_len,(int *)0x0,0);
    if ((int)uVar5 < 1) {
      return uVar5 - (int)uVar11;
    }
  }
  uVar14 = (ulong)uVar5;
  puVar2 = *ppuVar6;
  while (cVar10 = id[uVar11 + uVar14], (*(byte *)((long)puVar2 + (long)cVar10 * 2 + 1) & 0x20) != 0)
  {
    uVar11 = uVar11 + 1;
  }
  if (cVar10 == '=') {
    if ((name == (char **)0x0) || ((*(byte *)((long)puVar2 + (long)**name * 2 + 1) & 8) == 0)) {
      iVar9 = (int)id;
      uVar13 = -(uVar5 + iVar9) - uVar11;
      do {
        cVar10 = id[uVar11 + uVar14 + 1];
        uVar11 = uVar11 + 1;
        uVar12 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar12;
      } while ((*(byte *)((long)puVar2 + (long)cVar10 * 2 + 1) & 0x20) != 0);
      if ((cVar10 == '\'') || (cVar10 == '\"')) {
        pcVar7 = strchr(id + uVar14 + uVar11 + 1,(int)cVar10);
        if (pcVar7 == (char *)0x0) {
          return ~((int)uVar11 + uVar5);
        }
        if (value != (char **)0x0) {
          *value = id + uVar14 + uVar11 + 1;
        }
        iVar3 = (int)pcVar7;
        if (val_len != (int *)0x0) {
          *val_len = (iVar3 + ~(iVar9 + uVar5)) - (int)uVar11;
        }
        iVar9 = iVar3 - iVar9;
        pcVar7 = id + uVar11 + (long)(int)(uVar12 + iVar3) + uVar14;
        do {
          iVar9 = iVar9 + 1;
          pcVar7 = pcVar7 + 1;
          cVar10 = *pcVar7;
        } while ((*(byte *)((long)*ppuVar6 + (long)cVar10 * 2 + 1) & 0x20) != 0);
        goto LAB_00111300;
      }
    }
    uVar11 = (ulong)((int)uVar11 + uVar5);
LAB_00111351:
    return -(int)uVar11;
  }
  pcVar7 = id + uVar14 + uVar11;
  iVar9 = (int)(uVar14 + uVar11);
LAB_00111300:
  if (cVar10 != ']') {
    return -iVar9;
  }
  iVar9 = iVar9 + 1;
  if (has_predicate == (int *)0x0) {
    return iVar9;
  }
  if (pcVar7[1] != '[') {
    return iVar9;
  }
  *has_predicate = 1;
  return iVar9;
}

Assistant:

int
parse_schema_json_predicate(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                            const char **value, int *val_len, int *has_predicate)
{
    const char *ptr;
    int parsed = 0, ret;
    char quote;

    assert(id);
    if (mod_name) {
        *mod_name = NULL;
    }
    if (mod_name_len) {
        *mod_name_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }
    if (value) {
        *value = NULL;
    }
    if (val_len) {
        *val_len = 0;
    }
    if (has_predicate) {
        *has_predicate = 0;
    }

    if (id[0] != '[') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* identifier */
    if (id[0] == '.') {
        ret = 1;

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if (isdigit(id[0])) {
        if (id[0] == '0') {
            return -parsed;
        }
        ret = 1;
        while (isdigit(id[ret])) {
            ++ret;
        }

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if ((ret = parse_node_identifier(id, mod_name, mod_name_len, name, nam_len, NULL, 0)) < 1) {
        return -parsed + ret;
    }

    parsed += ret;
    id += ret;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* there is value as well */
    if (id[0] == '=') {
        if (name && isdigit(**name)) {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* ((DQUOTE string DQUOTE) / (SQUOTE string SQUOTE)) */
        if ((id[0] == '\"') || (id[0] == '\'')) {
            quote = id[0];

            ++parsed;
            ++id;

            if ((ptr = strchr(id, quote)) == NULL) {
                return -parsed;
            }
            ret = ptr - id;

            if (value) {
                *value = id;
            }
            if (val_len) {
                *val_len = ret;
            }

            parsed += ret + 1;
            id += ret + 1;
        } else {
            return -parsed;
        }

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (id[0] != ']') {
        return -parsed;
    }

    ++parsed;
    ++id;

    if ((id[0] == '[') && has_predicate) {
        *has_predicate = 1;
    }

    return parsed;
}